

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_dbi_open(MDB_txn *txn,char *name,uint flags,MDB_dbi *dbi)

{
  size_t sVar1;
  MDB_dbx *pMVar2;
  uint *puVar3;
  MDB_db *pMVar4;
  undefined8 uVar5;
  pgno_t pVar6;
  pgno_t pVar7;
  pgno_t pVar8;
  pgno_t pVar9;
  uint *puVar10;
  uchar uVar11;
  int iVar12;
  size_t __n;
  char *__ptr;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int exact;
  uint *local_210;
  MDB_val data;
  MDB_val key;
  long local_1e8 [6];
  MDB_cursor mc;
  
  if ((flags & 0xfffbff81) == 0) {
    iVar12 = -0x783e;
    if ((txn->mt_flags & 0x13) == 0) {
      if (name == (char *)0x0) {
        *dbi = 1;
        if ((flags & 0x7e) != 0) {
          uVar13 = (uint)txn->mt_dbs[1].md_flags;
          uVar15 = flags & 0x7e | uVar13;
          if (uVar15 != uVar13) {
            txn->mt_dbs[1].md_flags = (uint16_t)uVar15;
            *(byte *)&txn->mt_flags = (byte)txn->mt_flags | 4;
          }
        }
        mdb_default_cmp(txn,1);
LAB_0010b013:
        iVar12 = 0;
      }
      else {
        local_210 = dbi;
        if (txn->mt_dbxs[1].md_cmp == (MDB_cmp_func *)0x0) {
          mdb_default_cmp(txn,1);
        }
        __n = strlen(name);
        uVar13 = txn->mt_numdbs;
        uVar15 = 0;
        lVar16 = 0x68;
        for (uVar17 = 2; puVar10 = local_210, uVar17 < uVar13; uVar17 = uVar17 + 1) {
          sVar1 = *(size_t *)((long)txn->mt_dbxs + lVar16 + -8);
          if (sVar1 == 0) {
            if (uVar15 == 0) {
              uVar15 = (uint)uVar17;
            }
          }
          else if ((__n == sVar1) &&
                  (iVar12 = strncmp(name,*(char **)((long)&(txn->mt_dbxs->md_name).mv_size + lVar16)
                                    ,__n), iVar12 == 0)) {
            *local_210 = (uint)uVar17;
            goto LAB_0010b013;
          }
          lVar16 = lVar16 + 0x30;
        }
        if ((uVar15 != 0) || (iVar12 = -0x7847, uVar13 < txn->mt_env->me_maxdbs)) {
          if ((txn->mt_dbs[1].md_flags & 0xc) == 0) {
            exact = 0;
            key.mv_size = __n;
            key.mv_data = name;
            mdb_cursor_init(&mc,txn,1,(MDB_xcursor *)0x0);
            iVar12 = mdb_cursor_set(&mc,&key,&data,MDB_SET,&exact);
            if (iVar12 == -0x784e) {
              if (flags < 0x40000) {
                return -0x784e;
              }
            }
            else {
              if (iVar12 != 0) {
                return iVar12;
              }
              if ((*(ushort *)
                    ((long)mc.mc_pg[mc.mc_top]->mp_ptrs +
                    ((ulong)mc.mc_pg[mc.mc_top]->mp_ptrs[mc.mc_ki[mc.mc_top]] - 0xc)) & 6) != 2) {
                return -0x7840;
              }
            }
            __ptr = strdup(name);
            if (__ptr == (char *)0x0) {
              iVar12 = 0xc;
            }
            else {
              if (iVar12 == 0) {
                uVar11 = '\x1c';
              }
              else {
                data.mv_size = 0x30;
                data.mv_data = local_1e8;
                local_1e8[1] = 0;
                local_1e8[2] = 0;
                local_1e8[3] = 0;
                local_1e8[4] = 0;
                local_1e8[5] = 0xffffffffffffffff;
                local_1e8[0] = (ulong)(ushort)flags << 0x20;
                iVar12 = mdb_cursor_put(&mc,&key,&data,2);
                if (iVar12 != 0) {
                  free(__ptr);
                  return iVar12;
                }
                uVar11 = '\x1d';
              }
              uVar13 = uVar15;
              if (uVar15 == 0) {
                uVar13 = txn->mt_numdbs;
              }
              pMVar2 = txn->mt_dbxs;
              pMVar2[uVar13].md_name.mv_data = __ptr;
              pMVar2[uVar13].md_name.mv_size = __n;
              pMVar2[uVar13].md_rel = (MDB_rel_func *)0x0;
              txn->mt_dbflags[uVar13] = uVar11;
              puVar3 = txn->mt_env->me_dbiseqs;
              uVar14 = puVar3[uVar13] + 1;
              puVar3[uVar13] = uVar14;
              txn->mt_dbiseqs[uVar13] = uVar14;
              pMVar4 = txn->mt_dbs;
              uVar5 = *data.mv_data;
              pVar6 = *(pgno_t *)((long)data.mv_data + 8);
              pVar7 = *(pgno_t *)((long)data.mv_data + 0x10);
              pVar8 = *(pgno_t *)((long)data.mv_data + 0x18);
              pVar9 = *(pgno_t *)((long)data.mv_data + 0x28);
              pMVar4[uVar13].md_entries = *(mdb_size_t *)((long)data.mv_data + 0x20);
              (&pMVar4[uVar13].md_entries)[1] = pVar9;
              pMVar4[uVar13].md_leaf_pages = pVar7;
              (&pMVar4[uVar13].md_leaf_pages)[1] = pVar8;
              pMVar4 = pMVar4 + uVar13;
              pMVar4->md_pad = (int)uVar5;
              pMVar4->md_flags = (short)((ulong)uVar5 >> 0x20);
              pMVar4->md_depth = (short)((ulong)uVar5 >> 0x30);
              pMVar4->md_branch_pages = pVar6;
              *puVar10 = uVar13;
              mdb_default_cmp(txn,uVar13);
              iVar12 = 0;
              if (uVar15 == 0) {
                txn->mt_numdbs = txn->mt_numdbs + 1;
              }
            }
          }
          else {
            iVar12 = -0x7840;
            if (flags < 0x40000) {
              iVar12 = -0x784e;
            }
          }
        }
      }
    }
  }
  else {
    iVar12 = 0x16;
  }
  return iVar12;
}

Assistant:

int mdb_dbi_open(MDB_txn *txn, const char *name, unsigned int flags, MDB_dbi *dbi)
{
	MDB_val key, data;
	MDB_dbi i;
	MDB_cursor mc;
	MDB_db dummy;
	int rc, dbflag, exact;
	unsigned int unused = 0, seq;
	char *namedup;
	size_t len;

	if (flags & ~VALID_FLAGS)
		return EINVAL;
	if (txn->mt_flags & MDB_TXN_BLOCKED)
		return MDB_BAD_TXN;

	/* main DB? */
	if (!name) {
		*dbi = MAIN_DBI;
		if (flags & PERSISTENT_FLAGS) {
			uint16_t f2 = flags & PERSISTENT_FLAGS;
			/* make sure flag changes get committed */
			if ((txn->mt_dbs[MAIN_DBI].md_flags | f2) != txn->mt_dbs[MAIN_DBI].md_flags) {
				txn->mt_dbs[MAIN_DBI].md_flags |= f2;
				txn->mt_flags |= MDB_TXN_DIRTY;
			}
		}
		mdb_default_cmp(txn, MAIN_DBI);
		return MDB_SUCCESS;
	}

	if (txn->mt_dbxs[MAIN_DBI].md_cmp == NULL) {
		mdb_default_cmp(txn, MAIN_DBI);
	}

	/* Is the DB already open? */
	len = strlen(name);
	for (i=CORE_DBS; i<txn->mt_numdbs; i++) {
		if (!txn->mt_dbxs[i].md_name.mv_size) {
			/* Remember this free slot */
			if (!unused) unused = i;
			continue;
		}
		if (len == txn->mt_dbxs[i].md_name.mv_size &&
			!strncmp(name, txn->mt_dbxs[i].md_name.mv_data, len)) {
			*dbi = i;
			return MDB_SUCCESS;
		}
	}

	/* If no free slot and max hit, fail */
	if (!unused && txn->mt_numdbs >= txn->mt_env->me_maxdbs)
		return MDB_DBS_FULL;

	/* Cannot mix named databases with some mainDB flags */
	if (txn->mt_dbs[MAIN_DBI].md_flags & (MDB_DUPSORT|MDB_INTEGERKEY))
		return (flags & MDB_CREATE) ? MDB_INCOMPATIBLE : MDB_NOTFOUND;

	/* Find the DB info */
	dbflag = DB_NEW|DB_VALID|DB_USRVALID;
	exact = 0;
	key.mv_size = len;
	key.mv_data = (void *)name;
	mdb_cursor_init(&mc, txn, MAIN_DBI, NULL);
	rc = mdb_cursor_set(&mc, &key, &data, MDB_SET, &exact);
	if (rc == MDB_SUCCESS) {
		/* make sure this is actually a DB */
		MDB_node *node = NODEPTR(mc.mc_pg[mc.mc_top], mc.mc_ki[mc.mc_top]);
		if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) != F_SUBDATA)
			return MDB_INCOMPATIBLE;
	} else if (! (rc == MDB_NOTFOUND && (flags & MDB_CREATE))) {
		return rc;
	}

	/* Done here so we cannot fail after creating a new DB */
	if ((namedup = strdup(name)) == NULL)
		return ENOMEM;

	if (rc) {
		/* MDB_NOTFOUND and MDB_CREATE: Create new DB */
		data.mv_size = sizeof(MDB_db);
		data.mv_data = &dummy;
		memset(&dummy, 0, sizeof(dummy));
		dummy.md_root = P_INVALID;
		dummy.md_flags = flags & PERSISTENT_FLAGS;
		rc = mdb_cursor_put(&mc, &key, &data, F_SUBDATA);
		dbflag |= DB_DIRTY;
	}

	if (rc) {
		free(namedup);
	} else {
		/* Got info, register DBI in this txn */
		unsigned int slot = unused ? unused : txn->mt_numdbs;
		txn->mt_dbxs[slot].md_name.mv_data = namedup;
		txn->mt_dbxs[slot].md_name.mv_size = len;
		txn->mt_dbxs[slot].md_rel = NULL;
		txn->mt_dbflags[slot] = dbflag;
		/* txn-> and env-> are the same in read txns, use
		 * tmp variable to avoid undefined assignment
		 */
		seq = ++txn->mt_env->me_dbiseqs[slot];
		txn->mt_dbiseqs[slot] = seq;

		memcpy(&txn->mt_dbs[slot], data.mv_data, sizeof(MDB_db));
		*dbi = slot;
		mdb_default_cmp(txn, slot);
		if (!unused) {
			txn->mt_numdbs++;
		}
	}

	return rc;
}